

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.hpp
# Opt level: O2

void __thiscall
diy::Master::foreach<diy::detail::ReductionFunctor<PointBlock<3u>,diy::RegularMergePartners>>
          (Master *this,ReductionFunctor<PointBlock<3U>,_diy::RegularMergePartners> *f,Skip *s)

{
  Callback<PointBlock<3U>_> CStack_38;
  
  std::function<void(PointBlock<3u>*,diy::Master::ProxyWithLink_const&)>::
  function<diy::detail::ReductionFunctor<PointBlock<3u>,diy::RegularMergePartners>const&,void>
            ((function<void(PointBlock<3u>*,diy::Master::ProxyWithLink_const&)> *)&CStack_38,f);
  foreach_<PointBlock<3u>>(this,&CStack_38,s);
  Catch::clara::std::_Function_base::~_Function_base(&CStack_38.super__Function_base);
  return;
}

Assistant:

void          foreach(const F& f, const Skip& s = NeverSkip())
      {
          using Block = typename detail::block_traits<F>::type;
          foreach_<Block>(f, s);
      }